

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosType.cpp
# Opt level: O0

size_t adios2::helper::GetDataTypeSize(DataType type)

{
  DataType DVar1;
  DataType DVar2;
  DataType DVar3;
  DataType DVar4;
  DataType DVar5;
  DataType in_EDI;
  DataType commRank;
  undefined4 in_stack_ffffffffffffff44;
  string *in_stack_ffffffffffffff48;
  string *in_stack_ffffffffffffff50;
  allocator local_91;
  string local_90 [39];
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [36];
  DataType local_c;
  size_t local_8;
  
  local_c = in_EDI;
  DVar1 = GetDataType<std::__cxx11::string>();
  if (in_EDI == DVar1) {
    local_8 = 0x20;
  }
  else {
    DVar1 = local_c;
    DVar2 = GetDataType<char>();
    if (DVar1 == DVar2) {
      local_8 = 1;
    }
    else {
      DVar2 = local_c;
      DVar3 = GetDataType<signed_char>();
      if (DVar2 == DVar3) {
        local_8 = 1;
      }
      else {
        commRank = local_c;
        DVar4 = GetDataType<short>();
        DVar3 = local_c;
        if (commRank == DVar4) {
          local_8 = 2;
        }
        else {
          DVar5 = GetDataType<int>();
          DVar4 = local_c;
          if (DVar3 == DVar5) {
            local_8 = 4;
          }
          else {
            DVar5 = GetDataType<long>();
            DVar3 = local_c;
            if (DVar4 == DVar5) {
              local_8 = 8;
            }
            else {
              DVar5 = GetDataType<unsigned_char>();
              DVar4 = local_c;
              if (DVar3 == DVar5) {
                local_8 = 1;
              }
              else {
                DVar5 = GetDataType<unsigned_short>();
                DVar3 = local_c;
                if (DVar4 == DVar5) {
                  local_8 = 2;
                }
                else {
                  DVar5 = GetDataType<unsigned_int>();
                  DVar4 = local_c;
                  if (DVar3 == DVar5) {
                    local_8 = 4;
                  }
                  else {
                    DVar5 = GetDataType<unsigned_long>();
                    DVar3 = local_c;
                    if (DVar4 == DVar5) {
                      local_8 = 8;
                    }
                    else {
                      DVar5 = GetDataType<float>();
                      DVar4 = local_c;
                      if (DVar3 == DVar5) {
                        local_8 = 4;
                      }
                      else {
                        DVar5 = GetDataType<double>();
                        DVar3 = local_c;
                        if (DVar4 == DVar5) {
                          local_8 = 8;
                        }
                        else {
                          DVar5 = GetDataType<long_double>();
                          DVar4 = local_c;
                          if (DVar3 == DVar5) {
                            local_8 = 0x10;
                          }
                          else {
                            DVar3 = GetDataType<std::complex<float>>();
                            if (DVar4 == DVar3) {
                              local_8 = 8;
                            }
                            else {
                              DVar3 = GetDataType<std::complex<double>>();
                              if (local_c == DVar3) {
                                local_8 = 0x10;
                              }
                              else {
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string(local_30,"Helper",&local_31);
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string(local_68,"adiosType",&local_69);
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string(local_90,"GetDataTypeSize",&local_91);
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string
                                          ((string *)&stack0xffffffffffffff48,"unknown data type",
                                           (allocator *)&stack0xffffffffffffff47);
                                Throw<std::runtime_error>
                                          (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                                           (string *)CONCAT44(in_stack_ffffffffffffff44,in_EDI),
                                           (string *)CONCAT44(DVar1,DVar2),commRank);
                                std::__cxx11::string::~string((string *)&stack0xffffffffffffff48);
                                std::allocator<char>::~allocator
                                          ((allocator<char> *)&stack0xffffffffffffff47);
                                std::__cxx11::string::~string(local_90);
                                std::allocator<char>::~allocator((allocator<char> *)&local_91);
                                std::__cxx11::string::~string(local_68);
                                std::allocator<char>::~allocator((allocator<char> *)&local_69);
                                std::__cxx11::string::~string(local_30);
                                std::allocator<char>::~allocator((allocator<char> *)&local_31);
                                local_8 = 0;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return local_8;
}

Assistant:

size_t GetDataTypeSize(DataType type)
{
#define declare_type(T)                                                                            \
    if (type == helper::GetDataType<T>())                                                          \
    {                                                                                              \
        return sizeof(T);                                                                          \
    }
    ADIOS2_FOREACH_STDTYPE_1ARG(declare_type)
#undef declare_type
    helper::Throw<std::runtime_error>("Helper", "adiosType", "GetDataTypeSize",
                                      "unknown data type");
    return 0;
}